

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_glib.cpp
# Opt level: O3

gboolean socketNotifierSourceDispatch(GSource *source,GSourceFunc param_2,gpointer param_3)

{
  long lVar1;
  GSourceFuncs *pGVar2;
  long lVar3;
  long in_FS_OFFSET;
  undefined1 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)local_28,SockAct);
  *(undefined8 *)&source[1].ref_count = 0;
  pGVar2 = source[1].source_funcs;
  if (pGVar2 != (GSourceFuncs *)0x0) {
    lVar3 = 0;
    do {
      lVar1 = *(long *)(source[1].callback_funcs + lVar3 * 8);
      if ((*(ushort *)(lVar1 + 6) & *(ushort *)(lVar1 + 4)) != 0) {
        QCoreApplication::sendEvent(*(QObject **)(lVar1 + 8),(QEvent *)local_28);
        pGVar2 = source[1].source_funcs;
        lVar3 = *(long *)&source[1].ref_count;
      }
      lVar3 = lVar3 + 1;
      *(long *)&source[1].ref_count = lVar3;
    } while (lVar3 < (long)pGVar2);
  }
  QTimerEvent::~QTimerEvent((QTimerEvent *)local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return 1;
  }
  __stack_chk_fail();
}

Assistant:

static gboolean socketNotifierSourceDispatch(GSource *source, GSourceFunc, gpointer)
{
    QEvent event(QEvent::SockAct);

    GSocketNotifierSource *src = reinterpret_cast<GSocketNotifierSource *>(source);
    for (src->activeNotifierPos = 0; src->activeNotifierPos < src->pollfds.size();
         ++src->activeNotifierPos) {
        GPollFDWithQSocketNotifier *p = src->pollfds.at(src->activeNotifierPos);

        if ((p->pollfd.revents & p->pollfd.events) != 0)
            QCoreApplication::sendEvent(p->socketNotifier, &event);
    }

    return true; // ??? don't remove, right?
}